

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O0

void __thiscall
psy::C::DeclarationBinder::typeDeclarationAtTopWithTypeAtTop(DeclarationBinder *this)

{
  Type *paramTy;
  bool bVar1;
  reference ppDVar2;
  MIXIN_TypeableDeclarationSymbol *pMVar3;
  reference ppTVar4;
  ostream *poVar5;
  reference ppFVar6;
  value_type ty;
  MIXIN_TypeableDeclarationSymbol *typeableDecl;
  value_type decl;
  DeclarationBinder *this_local;
  
  bVar1 = std::
          stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
          ::empty(&this->decls_);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x37);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"<empty message>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    ppDVar2 = std::
              stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
              ::top(&this->decls_);
    if (*ppDVar2 == (value_type)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x37);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,"<empty message>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      ppDVar2 = std::
                stack<psy::C::DeclarationSymbol_*,_std::deque<psy::C::DeclarationSymbol_*,_std::allocator<psy::C::DeclarationSymbol_*>_>_>
                ::top(&this->decls_);
      pMVar3 = MIXIN_TypeableDeclarationSymbol::from(*ppDVar2);
      if (pMVar3 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x39);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,"<empty message>");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar1 = std::
                stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                ::empty(&this->tys_);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3b);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,"<empty message>");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          ppTVar4 = std::
                    stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                    ::top(&this->tys_);
          if (*ppTVar4 == (value_type)0x0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3b);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = std::operator<<(poVar5,"<empty message>");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          else {
            ppTVar4 = std::
                      stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
                      ::top(&this->tys_);
            paramTy = *ppTVar4;
            (*pMVar3->_vptr_MIXIN_TypeableDeclarationSymbol[3])(pMVar3,paramTy);
            bVar1 = std::
                    stack<psy::C::FunctionType_*,_std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>_>
                    ::empty(&this->pendingFuncTys_);
            if (!bVar1) {
              bVar1 = std::
                      stack<psy::C::FunctionType_*,_std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>_>
                      ::empty(&this->pendingFuncTys_);
              if (bVar1) {
                poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
                poVar5 = std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                                        );
                poVar5 = std::operator<<(poVar5,":");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3f);
                poVar5 = std::operator<<(poVar5," ");
                poVar5 = std::operator<<(poVar5,"<empty message>");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
              else {
                ppFVar6 = std::
                          stack<psy::C::FunctionType_*,_std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>_>
                          ::top(&this->pendingFuncTys_);
                FunctionType::addParameterType(*ppFVar6,paramTy);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

DECL_AT_TOP(auto decl, );
    auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
    PSY_ASSERT_2(typeableDecl, return);

    TY_AT_TOP(auto ty, );
    typeableDecl->setType(ty);

    if (!pendingFuncTys_.empty()) {
        PSY_ASSERT_2(!pendingFuncTys_.empty(), return);
        pendingFuncTys_.top()->addParameterType(ty);
    }
}

void DeclarationBinder::popTypesUntilNonDerivedDeclaratorType()
{
    TY_AT_TOP(auto ty, );
    while (true) {
        switch (ty->kind()) {
            case TypeKind::Qualified: {
                auto unqualTyK = ty->asQualifiedType()->unqualifiedType()->kind();
                if (!(unqualTyK == TypeKind::Array
                        || unqualTyK == TypeKind::Function
                        || unqualTyK == TypeKind::Pointer)) {
                    return;
                }
                [[fallthrough]];
            }
            case TypeKind::Array:
            case TypeKind::Function:
            case TypeKind::Pointer:
                popType();
                TY_AT_TOP(ty, );
                continue;
            case TypeKind::Error:
                PSY_ASSERT_1(false);
                return;
            default:
                return;
        }
    }
}